

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O2

void Handlers::Trade_Accept(Character *character,PacketReader *reader)

{
  unsigned_short uVar1;
  int iVar2;
  Character *this;
  string local_60;
  PacketBuilder builder;
  
  if ((character->trading == false) && ((character->nointeract & 2) == 0)) {
    PacketReader::GetChar(reader);
    uVar1 = PacketReader::GetShort(reader);
    this = Map::GetCharacterPID(character->map,(uint)uVar1);
    if (((this != (Character *)0x0) &&
        (((this->mapid == character->mapid && (this->trade_partner == character)) &&
         (this->trading == false)))) && ((this->nointeract & 2) == 0)) {
      PacketBuilder::PacketBuilder(&builder,PACKET_TRADE,PACKET_OPEN,0x1e);
      iVar2 = Character::PlayerID(this);
      PacketBuilder::AddShort(&builder,(unsigned_short)iVar2);
      (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_60,this);
      PacketBuilder::AddBreakString(&builder,&local_60,0xff);
      std::__cxx11::string::~string((string *)&local_60);
      iVar2 = Character::PlayerID(character);
      PacketBuilder::AddShort(&builder,(unsigned_short)iVar2);
      (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_60,character);
      PacketBuilder::AddBreakString(&builder,&local_60,0xff);
      std::__cxx11::string::~string((string *)&local_60);
      Character::Send(character,&builder);
      PacketBuilder::Reset(&builder,0x1e);
      iVar2 = Character::PlayerID(character);
      PacketBuilder::AddShort(&builder,(unsigned_short)iVar2);
      (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_60,character);
      PacketBuilder::AddBreakString(&builder,&local_60,0xff);
      std::__cxx11::string::~string((string *)&local_60);
      iVar2 = Character::PlayerID(this);
      PacketBuilder::AddShort(&builder,(unsigned_short)iVar2);
      (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_60,this);
      PacketBuilder::AddBreakString(&builder,&local_60,0xff);
      std::__cxx11::string::~string((string *)&local_60);
      Character::Send(this,&builder);
      character->trade_partner = this;
      character->trading = true;
      character->trade_agree = false;
      this->trading = true;
      this->trade_agree = false;
      PacketBuilder::~PacketBuilder(&builder);
    }
  }
  return;
}

Assistant:

void Trade_Accept(Character *character, PacketReader &reader)
{
	if (character->trading) return;
	if (!character->CanInteractItems()) return;

	/*int accept =*/ reader.GetChar();
	int victimid = reader.GetShort();

	Character *victim(character->map->GetCharacterPID(victimid));

	if (victim && victim->mapid == character->mapid && victim->trade_partner == character
	 && !victim->trading && victim->CanInteractItems())
	{
		PacketBuilder builder(PACKET_TRADE, PACKET_OPEN, 30);
		builder.AddShort(victim->PlayerID());
		builder.AddBreakString(victim->SourceName());
		builder.AddShort(character->PlayerID());
		builder.AddBreakString(character->SourceName());
		character->Send(builder);

		builder.Reset(30);
		builder.AddShort(character->PlayerID());
		builder.AddBreakString(character->SourceName());
		builder.AddShort(victim->PlayerID());
		builder.AddBreakString(victim->SourceName());
		victim->Send(builder);

		character->trade_partner = victim;
		character->trading = true;
		character->trade_agree = false;
		victim->trading = true;
		victim->trade_agree = false;
	}
}